

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O2

void __thiscall higan::FileForRead::FileForRead(FileForRead *this,string *file_path)

{
  int iVar1;
  FileStatus FVar2;
  
  std::__cxx11::string::string((string *)this,(string *)file_path);
  memset(&this->file_stat_,0,0x94);
  this->read_fd_ = -1;
  Buffer::Buffer(&this->cache_buffer_);
  iVar1 = stat((this->file_path_)._M_dataplus._M_p,(stat *)&this->file_stat_);
  if (iVar1 == 0) {
    if (((this->file_stat_).st_mode & 0xf000) == 0x4000) {
      FVar2 = IS_DIR;
    }
    else {
      iVar1 = open((this->file_path_)._M_dataplus._M_p,0x80000);
      this->read_fd_ = iVar1;
      FVar2 = iVar1 == -1 | OPEN_SUCCESS;
    }
    this->file_status_ = FVar2;
  }
  return;
}

Assistant:

FileForRead::FileForRead(const std::string& file_path):
		file_path_(file_path),
		file_stat_(),
		file_status_(FileStatus::NOT_EXIST),
		read_fd_(-1),
		cache_buffer_()
{
	if (stat(file_path_.c_str(), &file_stat_) == 0)
	{

		if (S_ISDIR(file_stat_.st_mode))
		{
			file_status_ = FileStatus::IS_DIR;
		}
		else
		{
			read_fd_ = open(file_path_.c_str(), O_RDONLY | O_CLOEXEC);
			if (read_fd_ == -1)
			{
				file_status_ = FileStatus::OPEN_ERROR;
			}
			else
			{
				file_status_ = FileStatus::OPEN_SUCCESS;
			}
		}
	}
}